

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# html_display_driver.cpp
# Opt level: O2

void __thiscall HtmlDisplayDriver::display(HtmlDisplayDriver *this,Document *doc,ostream *output)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  char cVar5;
  undefined4 uVar6;
  int iVar7;
  ostream *poVar8;
  ulong uVar9;
  long *plVar10;
  ulong uVar11;
  long *plVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  bool bVar17;
  char *pcVar18;
  ulong uVar19;
  bool bVar20;
  bool bVar21;
  string local_50 [32];
  
  if (this->field_0x8 == '\x01') {
    poVar8 = std::operator<<(output,"<!doctype html>");
    std::endl<char,std::char_traits<char>>(poVar8);
    poVar8 = std::operator<<(output,"<html lang=\"fr\">");
    std::endl<char,std::char_traits<char>>(poVar8);
    poVar8 = std::operator<<(output,"<head>");
    std::endl<char,std::char_traits<char>>(poVar8);
    poVar8 = std::operator<<(output,"<meta charset=\"utf-8\">");
    std::endl<char,std::char_traits<char>>(poVar8);
    poVar8 = std::operator<<(output,"<title>mdl generated HTML page</title>");
    std::endl<char,std::char_traits<char>>(poVar8);
    poVar8 = std::operator<<(output,"</head>");
    std::endl<char,std::char_traits<char>>(poVar8);
    poVar8 = std::operator<<(output,"<body>");
    std::endl<char,std::char_traits<char>>(poVar8);
  }
  bVar2 = false;
  bVar1 = false;
  bVar4 = false;
  bVar3 = false;
  uVar19 = 0;
  do {
    uVar9 = Document::size();
    if (uVar9 <= uVar19) {
      if (this->field_0x8 != '\0') {
        poVar8 = std::operator<<(output,"</body>");
        std::endl<char,std::char_traits<char>>(poVar8);
        poVar8 = std::operator<<(output,"</html>");
        std::endl<char,std::char_traits<char>>(poVar8);
      }
      return;
    }
    plVar10 = (long *)Document::operator[]((ulong)doc);
    uVar6 = (**(code **)(*plVar10 + 8))(plVar10);
    switch(uVar6) {
    case 1:
      pcVar18 = "<h1>";
      goto LAB_0012b6b9;
    case 2:
      pcVar18 = "<h2>";
      goto LAB_0012b6b9;
    case 3:
      pcVar18 = "<h3>";
LAB_0012b6b9:
      std::operator<<(output,pcVar18);
      break;
    default:
      poVar8 = std::operator<<(output,"<p>");
      std::endl<char,std::char_traits<char>>(poVar8);
      break;
    case 7:
      if (!bVar3) {
        poVar8 = std::operator<<(output,"<ol>");
        std::endl<char,std::char_traits<char>>(poVar8);
      }
      std::operator<<(output,"<li>");
      bVar3 = true;
      break;
    case 8:
      if (!bVar4) {
        poVar8 = std::operator<<(output,"<ul>");
        std::endl<char,std::char_traits<char>>(poVar8);
      }
      std::operator<<(output,"<li>");
      bVar4 = true;
      break;
    case 10:
      if (!bVar1) {
        poVar8 = std::operator<<(output,"<blockquote>");
        std::endl<char,std::char_traits<char>>(poVar8);
      }
      bVar1 = true;
      break;
    case 0xb:
      if (!bVar2) {
        poVar8 = std::operator<<(output,"<code>");
        std::endl<char,std::char_traits<char>>(poVar8);
      }
      bVar2 = true;
    }
    for (uVar9 = 0; uVar11 = Paragraph::size(), uVar9 < uVar11; uVar9 = uVar9 + 1) {
      plVar12 = (long *)Paragraph::operator[]((ulong)plVar10);
      if (plVar12 == (long *)0x0) {
        bVar21 = true;
LAB_0012b7fa:
        lVar16 = 0;
LAB_0012b7fc:
        bVar17 = false;
        bVar20 = false;
      }
      else {
        lVar13 = __dynamic_cast(plVar12,&LineElement::typeinfo,&BoldLineElement::typeinfo,0);
        bVar20 = lVar13 != 0;
        lVar14 = __dynamic_cast(plVar12,&LineElement::typeinfo,&ItalicLineElement::typeinfo);
        lVar15 = __dynamic_cast(plVar12,&LineElement::typeinfo,&CodeLineElement::typeinfo);
        bVar21 = lVar15 == 0;
        lVar16 = __dynamic_cast(plVar12,&LineElement::typeinfo,&UrlLineElement::typeinfo);
        if (lVar14 == 0) {
          if (lVar13 == 0) {
            if ((lVar15 == 0) || (iVar7 = (**(code **)(*plVar10 + 8))(plVar10), iVar7 == 0xb)) {
              if (lVar16 == 0) goto LAB_0012b7fa;
              poVar8 = std::operator<<(output,"<a href=\"");
              UrlLineElement::url_abi_cxx11_();
              poVar8 = std::operator<<(poVar8,local_50);
              std::operator<<(poVar8,"\">");
              std::__cxx11::string::~string(local_50);
              goto LAB_0012b7fc;
            }
            std::operator<<(output,"<code>");
            bVar17 = false;
            bVar20 = false;
            bVar21 = false;
          }
          else {
            std::operator<<(output,"<b>");
            bVar20 = true;
            bVar17 = false;
          }
        }
        else {
          std::operator<<(output,"<i>");
          bVar17 = true;
        }
      }
      (**(code **)(*plVar12 + 0x10))(local_50,plVar12);
      std::operator<<(output,local_50);
      std::__cxx11::string::~string(local_50);
      pcVar18 = "</i>";
      if (bVar20) {
        pcVar18 = "</b>";
      }
      if (lVar16 != 0) {
        pcVar18 = "</a>";
      }
      if ((!bVar17 && !bVar20) && lVar16 == 0) {
        if (!bVar21) {
          iVar7 = (**(code **)(*plVar10 + 8))(plVar10);
          pcVar18 = "</code>";
          if (iVar7 != 0xb) goto LAB_0012b87d;
        }
      }
      else {
LAB_0012b87d:
        std::operator<<(output,pcVar18);
      }
    }
    uVar6 = (**(code **)(*plVar10 + 8))(plVar10);
    switch(uVar6) {
    case 1:
      pcVar18 = "</h1>";
      break;
    case 2:
      pcVar18 = "</h2>";
      break;
    case 3:
      pcVar18 = "</h3>";
      break;
    default:
      pcVar18 = "</p>";
      break;
    case 7:
      poVar8 = std::operator<<(output,"</li>");
      std::endl<char,std::char_traits<char>>(poVar8);
      cVar5 = Paragraph::last();
      if (cVar5 == '\0') goto LAB_0012ba22;
      poVar8 = std::operator<<(output,"</ol>");
      poVar8 = std::endl<char,std::char_traits<char>>(poVar8);
      bVar3 = false;
      goto LAB_0012ba1a;
    case 8:
      poVar8 = std::operator<<(output,"</li>");
      std::endl<char,std::char_traits<char>>(poVar8);
      cVar5 = Paragraph::last();
      if (cVar5 != '\0') {
        poVar8 = std::operator<<(output,"</ul>");
        poVar8 = std::endl<char,std::char_traits<char>>(poVar8);
        bVar4 = false;
        goto LAB_0012ba1a;
      }
      goto LAB_0012ba22;
    case 10:
      std::endl<char,std::char_traits<char>>(output);
      cVar5 = Paragraph::last();
      if (cVar5 != '\0') {
        poVar8 = std::operator<<(output,"</blockquote>");
        poVar8 = std::endl<char,std::char_traits<char>>(poVar8);
        bVar1 = false;
        goto LAB_0012ba1a;
      }
      goto LAB_0012ba22;
    case 0xb:
      std::endl<char,std::char_traits<char>>(output);
      cVar5 = Paragraph::last();
      if (cVar5 != '\0') {
        poVar8 = std::operator<<(output,"</code>");
        poVar8 = std::endl<char,std::char_traits<char>>(poVar8);
        bVar2 = false;
        goto LAB_0012ba1a;
      }
      goto LAB_0012ba22;
    }
    poVar8 = std::operator<<(output,pcVar18);
LAB_0012ba1a:
    std::endl<char,std::char_traits<char>>(poVar8);
LAB_0012ba22:
    uVar19 = uVar19 + 1;
  } while( true );
}

Assistant:

void HtmlDisplayDriver::display(Document *doc, ostream & output) {
	Paragraph *p = nullptr;
	LineElement *l = nullptr;

	BoldLineElement *bold_le(nullptr);
	ItalicLineElement *italic_le(nullptr);
	CodeLineElement *code_le(nullptr);
	UrlLineElement *url_le(nullptr);

	bool is_verbatim(false), 
		 is_quotation(false),
		 is_ulist(false),
		 is_olist(false);

	if (_standalone) {
		output << "<!doctype html>" << endl;
		output << "<html lang=\"fr\">" << endl;
		output << "<head>" << endl;
		output << "<meta charset=\"utf-8\">" << endl;
		output << "<title>mdl generated HTML page</title>" << endl;
		output << "</head>" << endl;
		output << "<body>" << endl;
	}

	for (size_t i(0); i < doc->size(); ++i) {
		p = (*doc)[i];

		switch (p->level()) {
			case Paragraph::Level::Title1:
				output << "<h1>";
				break;
			case Paragraph::Level::Title2:
				output << "<h2>";
				break;
			case Paragraph::Level::Title3:
				output << "<h3>";
				break;
			case Paragraph::Level::Code:
				if (!is_verbatim) {
					output << "<code>" << endl;
					is_verbatim = true;
				}
				break;
			case Paragraph::Level::UList1:
				if (!is_ulist) {
					output << "<ul>" << endl;
					is_ulist = true;
				}
				output << "<li>";
				break;
			case Paragraph::Level::OList1:
				if (!is_olist) {
					output << "<ol>" << endl;
					is_olist = true;
				}
				output << "<li>";
				break;
			case Paragraph::Level::Quote:
				if (!is_quotation) {
					output << "<blockquote>" << endl;
					is_quotation = true;
				}
				break;
			default:
				output << "<p>" << endl;
				break;
		}

		for (size_t j(0); j < p->size(); ++j) {
			l = (*p)[j];

			bold_le = dynamic_cast<BoldLineElement*>(l);
			italic_le = dynamic_cast<ItalicLineElement*>(l);
			code_le = dynamic_cast<CodeLineElement*>(l);
			url_le = dynamic_cast<UrlLineElement*>(l);

			if (italic_le) {
				output << "<i>";
			} else if (bold_le) {
				output << "<b>";
			} else if (code_le and p->level() != Paragraph::Level::Code) {
				output << "<code>";
			} else if (url_le) {
				output << "<a href=\"" << url_le->url() << "\">";
			}

			output << l->content();

			if (url_le) {
				output << "</a>";
			} else if (bold_le) {
				output << "</b>";
			} else if (italic_le) {
				output << "</i>";
			} else if (code_le and p->level() != Paragraph::Level::Code) {
				output << "</code>";
			}
		}
		
		switch (p->level()) {
			case Paragraph::Level::Code:
				output << endl;
				if (p->last()) {
					output << "</code>" << endl << endl;
					is_verbatim = false;
				}
				break;
			case Paragraph::Level::Quote:
				output << endl;
				if (p->last()) {
					output << "</blockquote>" << endl << endl;
					is_quotation = false;
				}
				break;
			case Paragraph::Level::UList1:
				output << "</li>" << endl;
				if (p->last()) {
					output << "</ul>" << endl << endl;
					is_ulist = false;
				}
				break;
			case Paragraph::Level::OList1:
				output << "</li>" << endl;
				if (p->last()) {
					output << "</ol>" << endl << endl;
					is_olist = false;
				}
				break;
			case Paragraph::Level::Title1:
				output << "</h1>" << endl;
				break;
			case Paragraph::Level::Title2:
				output << "</h2>" << endl;
				break;
			case Paragraph::Level::Title3:
				output << "</h3>" << endl;
				break;
			default:
				output << "</p>" << endl;
				break;
		}
	}
	if (_standalone) {
		output << "</body>" << endl;
		output << "</html>" << endl;
	}
}